

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O2

char * __thiscall RecordField::FieldSize(RecordField *this,Output *out_cc,Env *env)

{
  DataPtr *pDVar1;
  DataPtr *pDVar2;
  char *pcVar3;
  
  if (this->field_size_expr != (char *)0x0) {
    return this->field_size_expr;
  }
  pDVar1 = getFieldBegin(this,out_cc,env);
  pDVar2 = getFieldEnd(this,out_cc,env);
  if (pDVar1->id_ == pDVar2->id_) {
    pcVar3 = nfmt("%d",(ulong)(uint)(pDVar2->offset_ - pDVar1->offset_));
  }
  else {
    pcVar3 = nfmt("(%s - %s)",(pDVar2->ptr_expr_)._M_dataplus._M_p,
                  (pDVar1->ptr_expr_)._M_dataplus._M_p);
  }
  this->field_size_expr = pcVar3;
  return pcVar3;
}

Assistant:

const char* RecordField::FieldSize(Output* out_cc, Env* env)
	{
	if ( field_size_expr )
		return field_size_expr;

	const DataPtr& begin = getFieldBegin(out_cc, env);
	const DataPtr& end = getFieldEnd(out_cc, env);
	if ( begin.id() == end.id() )
		field_size_expr = nfmt("%d", end.offset() - begin.offset());
	else
		field_size_expr = nfmt("(%s - %s)", end.ptr_expr(), begin.ptr_expr());
	return field_size_expr;
	}